

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_copySequencesToSeqStoreNoBlockDelim
                 (ZSTD_CCtx *cctx,ZSTD_sequencePosition *seqPos,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t blockSize,ZSTD_paramSwitch_e externalRepSearch)

{
  BYTE **ppBVar1;
  BYTE *pBVar2;
  uint uVar3;
  ZSTD_CDict *pZVar4;
  ZSTD_compressedBlockState_t *pZVar5;
  BYTE *pBVar6;
  undefined8 uVar7;
  bool bVar8;
  U32 offBase;
  ulong uVar9;
  seqDef *psVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  BYTE *pBVar18;
  U32 UVar19;
  U32 UVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  BYTE *ip;
  uint local_ac;
  size_t local_70;
  repcodes_t updatedRepcodes;
  BYTE *litLimit_w;
  
  UVar20 = seqPos->posInSequence;
  pZVar4 = cctx->cdict;
  if (pZVar4 == (ZSTD_CDict *)0x0) {
    if ((cctx->prefixDict).dict == (void *)0x0) {
      local_70 = 0;
      goto LAB_00f37ea6;
    }
    pZVar4 = (ZSTD_CDict *)&cctx->prefixDict;
  }
  local_70 = pZVar4->dictContentSize;
LAB_00f37ea6:
  UVar19 = seqPos->idx;
  pZVar5 = (cctx->blockState).prevCBlock;
  updatedRepcodes.rep[2] = pZVar5->rep[2];
  updatedRepcodes.rep._0_8_ = *(undefined8 *)pZVar5->rep;
  pBVar18 = (BYTE *)((long)src + (blockSize - 0x20));
  bVar8 = false;
  local_ac = 0;
  ip = (BYTE *)src;
  for (uVar22 = UVar20 + (int)blockSize; uVar25 = local_ac, uVar22 != 0; uVar22 = uVar22 - uVar25) {
    uVar16 = uVar22;
    if ((bVar8) || (uVar12 = (ulong)UVar19, inSeqsSize <= uVar12)) goto LAB_00f381f5;
    uVar3 = inSeqs[uVar12].litLength;
    uVar23 = inSeqs[uVar12].matchLength;
    uVar24 = uVar23 + uVar3;
    uVar13 = uVar24 - uVar22;
    if (uVar24 < uVar22 || uVar13 == 0) {
      uVar17 = (ulong)(uVar3 - UVar20);
      if (uVar3 < UVar20) {
        uVar17 = 0;
      }
      iVar21 = UVar20 - uVar3;
      bVar8 = false;
      if (UVar20 < uVar3) {
        iVar21 = 0;
      }
      uVar23 = uVar23 - iVar21;
      UVar20 = 0;
      uVar25 = uVar24;
    }
    else {
      uVar11 = uVar22 - uVar3;
      if (uVar22 < uVar3 || uVar11 == 0) goto LAB_00f381f5;
      uVar17 = (ulong)(uVar3 - UVar20);
      if (uVar3 < UVar20) {
        uVar17 = 0;
      }
      uVar16 = uVar3;
      uVar25 = uVar11;
      if (uVar23 <= blockSize) goto LAB_00f381f5;
      uVar23 = (uVar22 - UVar20) - (int)uVar17;
      uVar3 = (cctx->appliedParams).cParams.minMatch;
      if (uVar23 < uVar3) goto LAB_00f381f5;
      uVar25 = uVar3 - uVar13;
      if (uVar3 >= uVar13 && uVar25 != 0) {
        local_ac = uVar25;
      }
      if (uVar3 < uVar13) {
        uVar25 = 0;
      }
      uVar23 = uVar23 - uVar25;
      bVar8 = true;
    }
    uVar16 = (uint)uVar17;
    offBase = ZSTD_finalizeOffBase(inSeqs[uVar12].offset,updatedRepcodes.rep,(uint)(uVar16 == 0));
    ZSTD_updateRep(updatedRepcodes.rep,offBase,(uint)(uVar16 == 0));
    if ((cctx->appliedParams).validateSequences != 0) {
      uVar9 = (ulong)(uVar23 + uVar16) + seqPos->posInSrc;
      seqPos->posInSrc = uVar9;
      uVar14 = 1L << ((byte)(cctx->appliedParams).cParams.windowLog & 0x3f);
      uVar12 = local_70 + uVar9;
      if (uVar14 < uVar9) {
        uVar12 = uVar14;
      }
      if (uVar12 + 3 < (ulong)offBase) {
        return 0xffffffffffffff95;
      }
      if (uVar23 < 4 - ((cctx->appliedParams).cParams.minMatch == 3 ||
                       (cctx->appliedParams).extSeqProdFunc != (ZSTD_sequenceProducer_F)0x0)) {
        return 0xffffffffffffff95;
      }
    }
    if ((cctx->seqStore).maxNbSeq <= (ulong)(UVar19 - seqPos->idx)) {
      return 0xffffffffffffff95;
    }
    pBVar6 = (cctx->seqStore).lit;
    if (pBVar18 < ip + uVar17) {
      ZSTD_safecopyLiterals(pBVar6,ip,ip + uVar17,pBVar18);
LAB_00f380b4:
      ppBVar1 = &(cctx->seqStore).lit;
      *ppBVar1 = *ppBVar1 + uVar17;
      psVar10 = (cctx->seqStore).sequences;
      if (0xffff < uVar16) {
        (cctx->seqStore).longLengthType = ZSTD_llt_literalLength;
        (cctx->seqStore).longLengthPos =
             (U32)((ulong)((long)psVar10 - (long)(cctx->seqStore).sequencesStart) >> 3);
      }
    }
    else {
      uVar7 = *(undefined8 *)(ip + 8);
      *(undefined8 *)pBVar6 = *(undefined8 *)ip;
      *(undefined8 *)(pBVar6 + 8) = uVar7;
      if (0x10 < uVar16) {
        pBVar6 = (cctx->seqStore).lit;
        uVar7 = *(undefined8 *)(ip + 0x18);
        *(undefined8 *)(pBVar6 + 0x10) = *(undefined8 *)(ip + 0x10);
        *(undefined8 *)(pBVar6 + 0x18) = uVar7;
        if (0x10 < uVar17 - 0x10) {
          lVar15 = 0;
          do {
            uVar7 = *(undefined8 *)(ip + lVar15 + 0x20 + 8);
            pBVar2 = pBVar6 + lVar15 + 0x20;
            *(undefined8 *)pBVar2 = *(undefined8 *)(ip + lVar15 + 0x20);
            *(undefined8 *)(pBVar2 + 8) = uVar7;
            uVar7 = *(undefined8 *)(ip + lVar15 + 0x30 + 8);
            *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)(ip + lVar15 + 0x30);
            *(undefined8 *)(pBVar2 + 0x18) = uVar7;
            lVar15 = lVar15 + 0x20;
          } while (pBVar2 + 0x20 < pBVar6 + uVar17);
          goto LAB_00f380b4;
        }
      }
      ppBVar1 = &(cctx->seqStore).lit;
      *ppBVar1 = *ppBVar1 + uVar17;
      psVar10 = (cctx->seqStore).sequences;
    }
    psVar10->litLength = (U16)uVar17;
    psVar10->offBase = offBase;
    if (0xffff < (ulong)uVar23 - 3) {
      (cctx->seqStore).longLengthType = ZSTD_llt_matchLength;
      (cctx->seqStore).longLengthPos =
           (U32)((ulong)((long)psVar10 - (long)(cctx->seqStore).sequencesStart) >> 3);
    }
    ip = ip + (uVar23 + uVar16);
    psVar10->mlBase = (U16)((ulong)uVar23 - 3);
    (cctx->seqStore).sequences = psVar10 + 1;
    UVar19 = (UVar19 + 1) - (uint)(uVar22 < uVar24);
  }
  uVar16 = 0;
LAB_00f381f5:
  seqPos->idx = UVar19;
  seqPos->posInSequence = uVar16;
  pZVar5 = (cctx->blockState).nextCBlock;
  pZVar5->rep[2] = updatedRepcodes.rep[2];
  *(undefined8 *)pZVar5->rep = updatedRepcodes.rep._0_8_;
  pBVar18 = (BYTE *)((long)src + (blockSize - uVar25));
  if (ip != pBVar18) {
    uVar12 = (ulong)(uint)((int)pBVar18 - (int)ip);
    switchD_00916250::default((cctx->seqStore).lit,ip,uVar12);
    ppBVar1 = &(cctx->seqStore).lit;
    *ppBVar1 = *ppBVar1 + uVar12;
    seqPos->posInSrc = seqPos->posInSrc + uVar12;
  }
  return (ulong)uVar25;
}

Assistant:

size_t
ZSTD_copySequencesToSeqStoreNoBlockDelim(ZSTD_CCtx* cctx, ZSTD_sequencePosition* seqPos,
                                   const ZSTD_Sequence* const inSeqs, size_t inSeqsSize,
                                   const void* src, size_t blockSize, ZSTD_paramSwitch_e externalRepSearch)
{
    U32 idx = seqPos->idx;
    U32 startPosInSequence = seqPos->posInSequence;
    U32 endPosInSequence = seqPos->posInSequence + (U32)blockSize;
    size_t dictSize;
    BYTE const* ip = (BYTE const*)(src);
    BYTE const* iend = ip + blockSize;  /* May be adjusted if we decide to process fewer than blockSize bytes */
    repcodes_t updatedRepcodes;
    U32 bytesAdjustment = 0;
    U32 finalMatchSplit = 0;

    /* TODO(embg) support fast parsing mode in noBlockDelim mode */
    (void)externalRepSearch;

    if (cctx->cdict) {
        dictSize = cctx->cdict->dictContentSize;
    } else if (cctx->prefixDict.dict) {
        dictSize = cctx->prefixDict.dictSize;
    } else {
        dictSize = 0;
    }
    DEBUGLOG(5, "ZSTD_copySequencesToSeqStoreNoBlockDelim: idx: %u PIS: %u blockSize: %zu", idx, startPosInSequence, blockSize);
    DEBUGLOG(5, "Start seq: idx: %u (of: %u ml: %u ll: %u)", idx, inSeqs[idx].offset, inSeqs[idx].matchLength, inSeqs[idx].litLength);
    ZSTD_memcpy(updatedRepcodes.rep, cctx->blockState.prevCBlock->rep, sizeof(repcodes_t));
    while (endPosInSequence && idx < inSeqsSize && !finalMatchSplit) {
        const ZSTD_Sequence currSeq = inSeqs[idx];
        U32 litLength = currSeq.litLength;
        U32 matchLength = currSeq.matchLength;
        U32 const rawOffset = currSeq.offset;
        U32 offBase;

        /* Modify the sequence depending on where endPosInSequence lies */
        if (endPosInSequence >= currSeq.litLength + currSeq.matchLength) {
            if (startPosInSequence >= litLength) {
                startPosInSequence -= litLength;
                litLength = 0;
                matchLength -= startPosInSequence;
            } else {
                litLength -= startPosInSequence;
            }
            /* Move to the next sequence */
            endPosInSequence -= currSeq.litLength + currSeq.matchLength;
            startPosInSequence = 0;
        } else {
            /* This is the final (partial) sequence we're adding from inSeqs, and endPosInSequence
               does not reach the end of the match. So, we have to split the sequence */
            DEBUGLOG(6, "Require a split: diff: %u, idx: %u PIS: %u",
                     currSeq.litLength + currSeq.matchLength - endPosInSequence, idx, endPosInSequence);
            if (endPosInSequence > litLength) {
                U32 firstHalfMatchLength;
                litLength = startPosInSequence >= litLength ? 0 : litLength - startPosInSequence;
                firstHalfMatchLength = endPosInSequence - startPosInSequence - litLength;
                if (matchLength > blockSize && firstHalfMatchLength >= cctx->appliedParams.cParams.minMatch) {
                    /* Only ever split the match if it is larger than the block size */
                    U32 secondHalfMatchLength = currSeq.matchLength + currSeq.litLength - endPosInSequence;
                    if (secondHalfMatchLength < cctx->appliedParams.cParams.minMatch) {
                        /* Move the endPosInSequence backward so that it creates match of minMatch length */
                        endPosInSequence -= cctx->appliedParams.cParams.minMatch - secondHalfMatchLength;
                        bytesAdjustment = cctx->appliedParams.cParams.minMatch - secondHalfMatchLength;
                        firstHalfMatchLength -= bytesAdjustment;
                    }
                    matchLength = firstHalfMatchLength;
                    /* Flag that we split the last match - after storing the sequence, exit the loop,
                       but keep the value of endPosInSequence */
                    finalMatchSplit = 1;
                } else {
                    /* Move the position in sequence backwards so that we don't split match, and break to store
                     * the last literals. We use the original currSeq.litLength as a marker for where endPosInSequence
                     * should go. We prefer to do this whenever it is not necessary to split the match, or if doing so
                     * would cause the first half of the match to be too small
                     */
                    bytesAdjustment = endPosInSequence - currSeq.litLength;
                    endPosInSequence = currSeq.litLength;
                    break;
                }
            } else {
                /* This sequence ends inside the literals, break to store the last literals */
                break;
            }
        }
        /* Check if this offset can be represented with a repcode */
        {   U32 const ll0 = (litLength == 0);
            offBase = ZSTD_finalizeOffBase(rawOffset, updatedRepcodes.rep, ll0);
            ZSTD_updateRep(updatedRepcodes.rep, offBase, ll0);
        }

        if (cctx->appliedParams.validateSequences) {
            seqPos->posInSrc += litLength + matchLength;
            FORWARD_IF_ERROR(ZSTD_validateSequence(offBase, matchLength, cctx->appliedParams.cParams.minMatch, seqPos->posInSrc,
                                                   cctx->appliedParams.cParams.windowLog, dictSize, ZSTD_hasExtSeqProd(&cctx->appliedParams)),
                                                   "Sequence validation failed");
        }
        DEBUGLOG(6, "Storing sequence: (of: %u, ml: %u, ll: %u)", offBase, matchLength, litLength);
        RETURN_ERROR_IF(idx - seqPos->idx >= cctx->seqStore.maxNbSeq, externalSequences_invalid,
                        "Not enough memory allocated. Try adjusting ZSTD_c_minMatch.");
        ZSTD_storeSeq(&cctx->seqStore, litLength, ip, iend, offBase, matchLength);
        ip += matchLength + litLength;
        if (!finalMatchSplit)
            idx++; /* Next Sequence */
    }
    DEBUGLOG(5, "Ending seq: idx: %u (of: %u ml: %u ll: %u)", idx, inSeqs[idx].offset, inSeqs[idx].matchLength, inSeqs[idx].litLength);
    assert(idx == inSeqsSize || endPosInSequence <= inSeqs[idx].litLength + inSeqs[idx].matchLength);
    seqPos->idx = idx;
    seqPos->posInSequence = endPosInSequence;
    ZSTD_memcpy(cctx->blockState.nextCBlock->rep, updatedRepcodes.rep, sizeof(repcodes_t));

    iend -= bytesAdjustment;
    if (ip != iend) {
        /* Store any last literals */
        U32 lastLLSize = (U32)(iend - ip);
        assert(ip <= iend);
        DEBUGLOG(6, "Storing last literals of size: %u", lastLLSize);
        ZSTD_storeLastLiterals(&cctx->seqStore, ip, lastLLSize);
        seqPos->posInSrc += lastLLSize;
    }

    return bytesAdjustment;
}